

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

Iterator * __thiscall
kj::_::BTreeImpl::insert(Iterator *__return_storage_ptr__,BTreeImpl *this,SearchKey *searchKey)

{
  Parent *pPVar1;
  undefined8 *puVar2;
  uint uVar3;
  NodeUnion *pNVar4;
  NodeUnion *pNVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  undefined8 uVar17;
  char cVar18;
  uint indexInParent;
  uint uVar19;
  Leaf *pLVar20;
  uint i;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  Parent *parent;
  Parent *pPVar24;
  
  uVar22 = this->height;
  if (this->freelistSize < uVar22 + 2) {
    if ((((uVar22 == 0) || (this->freelistSize < uVar22)) ||
        ((this->tree->field_0).freelist.zero[6] != 0)) &&
       (growTree(this,0), this->freelistHead == 0)) {
      this->freelistHead = (this->tree->field_0).freelist.nextOffset + 1;
      this->freelistSize = this->freelistSize - 1;
    }
    uVar22 = this->height;
  }
  if (uVar22 == 0) {
    indexInParent = 0;
    parent = (Parent *)0x0;
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    indexInParent = 0;
    pPVar24 = (Parent *)0x0;
    do {
      pNVar4 = this->tree;
      parent = (Parent *)(pNVar4 + uVar23);
      if (pNVar4[uVar23].field_0.freelist.zero[6] != 0) {
        uVar3 = this->freelistHead;
        uVar19 = this->freelistSize;
        pPVar1 = (Parent *)(pNVar4 + uVar3);
        uVar21 = pNVar4[uVar3].field_0.freelist.nextOffset + uVar3 + 1;
        this->freelistHead = uVar21;
        this->freelistSize = uVar19 - 1;
        if (pPVar24 == (Parent *)0x0) {
          this->freelistHead = pNVar4[uVar21].field_0.freelist.nextOffset + uVar21 + 1;
          this->freelistSize = uVar19 - 2;
          uVar19 = parent->keys[3].i;
          pNVar4[uVar21].field_0.freelist.zero[2] = parent->keys[6].i;
          *(undefined8 *)((long)&pNVar4[uVar21].field_0 + 4) = *(undefined8 *)(parent->keys + 4);
          parent->keys[3] = 0;
          parent->keys[4] = 0;
          parent->keys[5] = 0;
          parent->keys[6] = 0;
          uVar17 = *(undefined8 *)(parent->children + 6);
          puVar2 = (undefined8 *)((long)&pNVar4[uVar21].field_0 + 0x20);
          *puVar2 = *(undefined8 *)(parent->children + 4);
          puVar2[1] = uVar17;
          parent->children[4] = 0;
          parent->children[5] = 0;
          parent->children[6] = 0;
          parent->children[7] = 0;
          pPVar1->children[4] = 0;
          pPVar1->children[5] = 0;
          pPVar1->children[6] = 0;
          pPVar1->children[7] = 0;
          iVar6 = (((anon_union_64_3_a03489b4_for_NodeUnion_0 *)&parent->unused)->freelist).
                  nextOffset;
          uVar7 = parent->keys[0].i;
          uVar8 = parent->keys[1].i;
          uVar9 = parent->keys[2].i;
          uVar10 = parent->keys[3].i;
          uVar11 = parent->keys[4].i;
          uVar12 = parent->keys[5].i;
          uVar13 = parent->keys[6].i;
          uVar14 = parent->children[1];
          uVar15 = parent->children[2];
          uVar16 = parent->children[3];
          pPVar1->children[0] = parent->children[0];
          pPVar1->children[1] = uVar14;
          pPVar1->children[2] = uVar15;
          pPVar1->children[3] = uVar16;
          pPVar1->keys[3].i = uVar10;
          pPVar1->keys[4].i = uVar11;
          pPVar1->keys[5].i = uVar12;
          pPVar1->keys[6].i = uVar13;
          (((anon_union_64_3_a03489b4_for_NodeUnion_0 *)&pPVar1->unused)->freelist).nextOffset =
               iVar6;
          pPVar1->keys[0].i = uVar7;
          pPVar1->keys[1].i = uVar8;
          pPVar1->keys[2].i = uVar9;
          pNVar5 = this->tree;
          (pNVar5->field_0).freelist.zero[0] = uVar19;
          (pNVar5->field_0).freelist.zero[7] = uVar3;
          (pNVar5->field_0).freelist.zero[8] = uVar21;
          *(undefined8 *)((long)&pNVar5->field_0 + 8) = 0;
          *(undefined8 *)((long)&pNVar5->field_0 + 0x10) = 0;
          *(undefined8 *)((long)&pNVar5->field_0 + 0x18) = 0;
          *(undefined8 *)((long)&pNVar5->field_0 + 0x28) = 0;
          *(undefined8 *)((long)&pNVar5->field_0 + 0x30) = 0;
          *(undefined8 *)((long)&pNVar5->field_0 + 0x38) = 0;
          this->height = this->height + 1;
          cVar18 = (**(code **)(*(long *)searchKey + 0x10))(searchKey,uVar19 - 1);
          parent = (Parent *)(pNVar4 + uVar21);
          if (cVar18 == '\0') {
            parent = pPVar1;
          }
        }
        else {
          uVar19 = parent->keys[3].i;
          pPVar1->keys[2].i = parent->keys[6].i;
          *(undefined8 *)pPVar1->keys = *(undefined8 *)(parent->keys + 4);
          parent->keys[3] = 0;
          parent->keys[4] = 0;
          parent->keys[5] = 0;
          parent->keys[6] = 0;
          uVar17 = *(undefined8 *)(parent->children + 6);
          *(undefined8 *)pPVar1->children = *(undefined8 *)(parent->children + 4);
          *(undefined8 *)(pPVar1->children + 2) = uVar17;
          parent->children[4] = 0;
          parent->children[5] = 0;
          parent->children[6] = 0;
          parent->children[7] = 0;
          memmove(pPVar24->keys + (ulong)indexInParent + 1,pPVar24->keys + indexInParent,
                  (ulong)(indexInParent + 1) * -4 + 0x1c);
          ((Parent *)(pPVar24->keys + (ulong)indexInParent + 1 + -1))->unused = uVar19;
          memmove(pPVar24->children + (ulong)indexInParent + 2,
                  pPVar24->children + (ulong)indexInParent + 1,
                  (ulong)(indexInParent + 2) * -4 + 0x20);
          pPVar24->children[indexInParent + 1] = uVar3;
          cVar18 = (**(code **)(*(long *)searchKey + 0x10))(searchKey,uVar19 - 1);
          if (cVar18 != '\0') {
            parent = pPVar1;
          }
        }
      }
      indexInParent = (*(code *)**(undefined8 **)searchKey)(searchKey,parent);
      uVar23 = (ulong)parent->children[indexInParent];
      uVar22 = uVar22 - 1;
      pPVar24 = parent;
    } while (uVar22 != 0);
  }
  pLVar20 = insertHelper<kj::_::BTreeImpl::Leaf>
                      (this,searchKey,(Leaf *)(this->tree + uVar23),parent,indexInParent,
                       (uint)uVar23);
  pNVar4 = this->tree;
  uVar19 = (**(code **)(*(long *)searchKey + 8))(searchKey,pLVar20);
  __return_storage_ptr__->tree = pNVar4;
  __return_storage_ptr__->leaf = pLVar20;
  __return_storage_ptr__->row = uVar19;
  return __return_storage_ptr__;
}

Assistant:

BTreeImpl::Iterator BTreeImpl::insert(const SearchKey& searchKey) {
  // Like search() but ensures that there is room in the leaf node to insert a new row.

  // If we split the root node it will generate two new nodes. If we split any other node in the
  // path it will generate one new node. `height` doesn't count leaf nodes, but we can equivalently
  // think of it as not counting the root node, so in the worst case we may allocate height + 2
  // new nodes.
  //
  // (Also note that if the tree is currently empty, then `tree` points to a dummy root node in
  // read-only memory. We definitely need to allocate a real tree node array in this case, and
  // we'll start out allocating space for four nodes, which will be all we need up to 28 rows.)
  if (freelistSize < height + 2) {
    if (height > 0 && !tree[0].parent.isFull() && freelistSize >= height) {
      // Slight optimization: The root node is not full, so we're definitely not going to split it.
      // That means that the maximum allocations we might do is equal to `height`, not
      // `height + 2`, and we have that much space, so no need to grow yet.
      //
      // This optimization is particularly important for small trees, e.g. when treeCapacity is 4
      // and the tree so far consists of a root and two children, we definitely don't need to grow
      // the tree yet.
    } else {
      growTree();

      if (freelistHead == 0) {
        // We have no root yet. Allocate one.
        KJ_ASSERT(alloc<Parent>().index == 0);
      }
    }
  }

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = insertHelper(searchKey, tree[pos].parent, parent, indexInParent, pos);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
  }

  Leaf& leaf = insertHelper(searchKey, tree[pos].leaf, parent, indexInParent, pos);

  // Fun fact: Unlike erase(), there's no need to climb back up the tree modifying keys, because
  // either the newly-inserted node will not be the last in the leaf (and thus parent keys aren't
  // modified), or the leaf is the last leaf in the tree (and thus there's no parent key to
  // modify).

  return { tree, &leaf, searchKey.search(leaf) };
}